

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int rn3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int *piVar5;
  int *piVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  undefined8 uVar7;
  undefined8 vec_01;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  cpp_dec_float<50U,_int,_void> *v;
  uint uVar16;
  uint uVar17;
  undefined4 uVar18;
  long lVar19;
  int *piVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  undefined4 in_stack_00000064;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  int *local_2f8;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  piVar20 = (int *)eps2.m_backend.data._M_elems._16_8_;
  v = (cpp_dec_float<50U,_int,_void> *)eps2.m_backend._40_8_;
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x20);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._40_8_;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 8);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x10);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x18);
  local_e8.m_backend.exp = *(int *)(eps2.m_backend._40_8_ + 0x28);
  local_e8.m_backend.neg = *(bool *)(eps2.m_backend._40_8_ + 0x2c);
  local_e8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x30);
  vSolveLright3(this,rhs,ridx,&rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),&local_a8,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend._48_8_,(int *)rhs2,(int *)&ridx2,&local_e8);
  if (CONCAT44(in_stack_00000064,rn2) == 0) {
    if (rn < 1) {
      uVar21 = 0;
    }
    else {
      piVar5 = (this->row).perm;
      lVar22 = 0;
      uVar15 = 0;
      do {
        uVar21 = (uint)uVar15;
        iVar10 = ridx[lVar22];
        result.m_backend.exp = rhs[iVar10].m_backend.exp;
        result.m_backend.neg = rhs[iVar10].m_backend.neg;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[iVar10].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar10].m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[iVar10].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar10].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        result.m_backend.fpclass = rhs[iVar10].m_backend.fpclass;
        result.m_backend.prec_elem = rhs[iVar10].m_backend.prec_elem;
        local_2e8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_2e8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_2e8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_2e8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_2e8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_2e8.exp = (eps->m_backend).exp;
        local_2e8.neg = (eps->m_backend).neg;
        local_2e8.fpclass = (eps->m_backend).fpclass;
        local_2e8.prec_elem = (eps->m_backend).prec_elem;
        if ((result.m_backend.neg == true) &&
           (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        if (local_2e8.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN)
        {
LAB_0028ab50:
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar10].m_backend,0);
        }
        else {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&result.m_backend,&local_2e8);
          if (iVar9 < 1) goto LAB_0028ab50;
          iVar10 = piVar5[iVar10];
          uVar14 = uVar21;
          if (0 < (int)uVar21) {
            do {
              uVar16 = (uint)uVar15 - 1;
              uVar12 = uVar16 >> 1;
              uVar14 = (uint)uVar15;
              if (iVar10 <= ridx[uVar12]) break;
              ridx[uVar15] = ridx[uVar12];
              uVar15 = (ulong)uVar12;
              uVar14 = uVar12;
            } while (1 < uVar16);
          }
          uVar15 = (ulong)(uVar21 + 1);
          ridx[(int)uVar14] = iVar10;
        }
        lVar22 = lVar22 + 1;
        uVar21 = (int)uVar15;
      } while (lVar22 < rn);
    }
  }
  else {
    if (rn < 1) {
      uVar21 = 0;
    }
    else {
      local_2f8 = (int *)eps3.m_backend.data._M_elems._0_8_;
      piVar20 = (this->row).perm;
      lVar22 = 0;
      uVar21 = 0;
      do {
        iVar10 = ridx[lVar22];
        lVar19 = (long)iVar10;
        lVar23 = lVar19 * 0x38;
        result_2.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[lVar19].m_backend.data._M_elems + 8);
        result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar19].m_backend.data._M_elems;
        result_2.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[lVar19].m_backend.data._M_elems + 2);
        puVar1 = rhs[lVar19].m_backend.data._M_elems + 4;
        result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result_2.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        iVar9 = rhs[lVar19].m_backend.exp;
        bVar2 = rhs[lVar19].m_backend.neg;
        fVar3 = rhs[lVar19].m_backend.fpclass;
        iVar4 = rhs[lVar19].m_backend.prec_elem;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[lVar19].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar19].m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[lVar19].m_backend.data._M_elems + 2);
        puVar1 = rhs[lVar19].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_2a8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_2a8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_2a8.exp = (eps->m_backend).exp;
        local_2a8.neg = (eps->m_backend).neg;
        local_2a8.fpclass = (eps->m_backend).fpclass;
        local_2a8.prec_elem = (eps->m_backend).prec_elem;
        result.m_backend.prec_elem = iVar4;
        result.m_backend.fpclass = fVar3;
        result.m_backend.neg = bVar2;
        if ((bVar2 == true) &&
           (result.m_backend.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        result.m_backend.exp = iVar9;
        if (local_2a8.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) {
LAB_0028a984:
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[lVar19].m_backend,0);
        }
        else {
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&result.m_backend,&local_2a8);
          if (iVar8 < 1) goto LAB_0028a984;
          *local_2f8 = iVar10;
          iVar10 = piVar20[lVar19];
          uVar14 = uVar21;
          if (0 < (int)uVar21) {
            do {
              uVar12 = uVar14 - 1;
              uVar16 = uVar12 >> 1;
              if (iVar10 <= ridx[uVar16]) break;
              ridx[uVar14] = ridx[uVar16];
              uVar14 = uVar16;
            } while (1 < uVar12);
          }
          local_2f8 = local_2f8 + 1;
          uVar21 = uVar21 + 1;
          ridx[(int)uVar14] = iVar10;
          lVar19 = CONCAT44(in_stack_00000064,rn2);
          *(undefined8 *)(lVar19 + 0x20 + lVar23) = result_2.m_backend.data._M_elems._32_8_;
          puVar1 = (uint *)(lVar19 + 0x10 + lVar23);
          *(undefined8 *)puVar1 = result_2.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = result_2.m_backend.data._M_elems._24_8_;
          *(undefined8 *)(lVar19 + lVar23) = result_2.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((uint *)(lVar19 + lVar23) + 2) = result_2.m_backend.data._M_elems._8_8_;
          *(int *)(lVar19 + 0x28 + lVar23) = iVar9;
          *(bool *)(lVar19 + 0x2c + lVar23) = bVar2;
          *(fpclass_type *)(lVar19 + 0x30 + lVar23) = fVar3;
          *(int32_t *)(lVar19 + 0x34 + lVar23) = iVar4;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < rn);
    }
    (vec3->m_backend).data._M_elems[0] = uVar21;
    v = (cpp_dec_float<50U,_int,_void> *)eps2.m_backend._40_8_;
    piVar20 = (int *)eps2.m_backend.data._M_elems._16_8_;
  }
  rn = uVar21;
  piVar5 = ridx2;
  if ((double)(int)eps2.m_backend.data._M_elems[6] <= (double)this->thedim * 0.2) {
    if ((int)eps2.m_backend.data._M_elems[6] < 1) {
      uVar21 = 0;
    }
    else {
      piVar6 = (this->row).perm;
      lVar22 = 0;
      uVar15 = 0;
      do {
        uVar21 = (uint)uVar15;
        lVar19 = (long)piVar20[lVar22];
        lVar23 = lVar19 * 0x38;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x20 + lVar23);
        result.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + lVar23);
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._8_8_ + lVar23) + 2);
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x10 + lVar23);
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        result.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x28 + lVar23);
        result.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x2c + lVar23);
        result.m_backend._48_8_ =
             *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x30 + lVar23);
        result_2.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
        result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
        result_2.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
        result_2.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
        result_2.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
        result_2.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
        result_2.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
        uVar11 = *(ulong *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
        if (result_2.m_backend.data._M_elems[0] != 0 || (int)uVar11 != 0) {
          result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
        }
        result_2.m_backend._48_8_ = uVar11;
        ridx2 = piVar5;
        uVar14 = uVar21;
        if (result.m_backend.fpclass == cpp_dec_float_NaN || (int)uVar11 == 2) {
LAB_0028ad25:
          if ((result.m_backend.fpclass != cpp_dec_float_NaN) && ((int)uVar11 != 2)) {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result.m_backend,
                                (cpp_dec_float<50U,_int,_void> *)eps2.m_backend.data._M_elems._0_8_)
            ;
            if (0 < iVar10) {
              iVar10 = piVar6[lVar19];
              if (0 < (int)uVar21) {
                do {
                  uVar16 = (uint)uVar15 - 1;
                  uVar12 = uVar16 >> 1;
                  uVar14 = (uint)uVar15;
                  if (iVar10 <= piVar20[uVar12]) break;
                  piVar20[uVar15] = piVar20[uVar12];
                  uVar15 = (ulong)uVar12;
                  uVar14 = uVar12;
                } while (1 < uVar16);
              }
              goto LAB_0028add0;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)(lVar23 + eps2.m_backend.data._M_elems._8_8_),
                     0);
          piVar5 = ridx2;
        }
        else {
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&result.m_backend,&result_2.m_backend);
          if (-1 < iVar10) {
            uVar11 = (ulong)*(uint *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
            goto LAB_0028ad25;
          }
          iVar10 = piVar6[lVar19];
          if (0 < (int)uVar21) {
            do {
              uVar16 = (uint)uVar15 - 1;
              uVar12 = uVar16 >> 1;
              uVar14 = (uint)uVar15;
              if (iVar10 <= piVar20[uVar12]) break;
              piVar20[uVar15] = piVar20[uVar12];
              uVar15 = (ulong)uVar12;
              uVar14 = uVar12;
            } while (1 < uVar16);
          }
LAB_0028add0:
          uVar15 = (ulong)(uVar21 + 1);
          piVar20[(int)uVar14] = iVar10;
          piVar5 = ridx2;
        }
        lVar22 = lVar22 + 1;
        uVar21 = (uint)uVar15;
      } while (lVar22 < (int)eps2.m_backend.data._M_elems[6]);
    }
  }
  else {
    *piVar20 = this->thedim + -1;
    uVar21 = eps2.m_backend.data._M_elems[6];
  }
  eps2.m_backend.data._M_elems[6] = uVar21;
  ridx2._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
  ridx2._0_4_ = (int)piVar5;
  if ((double)(int)ridx2 <= (double)this->thedim * 0.2) {
    if ((int)ridx2 < 1) {
      uVar18 = 0;
    }
    else {
      piVar20 = (this->row).perm;
      lVar22 = 0;
      uVar15 = 0;
      do {
        uVar21 = (uint)uVar15;
        lVar19 = (long)(int)(rhs2->m_backend).data._M_elems[lVar22];
        lVar23 = lVar19 * 0x38;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(eps2.m_backend._48_8_ + 0x20 + lVar23);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + lVar23);
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((uint *)(eps2.m_backend._48_8_ + lVar23) + 2);
        puVar1 = (uint *)(eps2.m_backend._48_8_ + 0x10 + lVar23);
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        result.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28 + lVar23);
        result.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c + lVar23);
        result.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30 + lVar23);
        result_2.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
        result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
        result_2.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
        result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
        result_2.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
        result_2.m_backend.exp = v->exp;
        result_2.m_backend.neg = v->neg;
        uVar11._0_4_ = v->fpclass;
        uVar11._4_4_ = v->prec_elem;
        if (result_2.m_backend.data._M_elems[0] != 0 || (undefined4)uVar11 != 0) {
          result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
        }
        result_2.m_backend._48_8_ = uVar11;
        ridx2 = piVar5;
        uVar14 = uVar21;
        if (result.m_backend.fpclass == cpp_dec_float_NaN || (undefined4)uVar11 == 2) {
LAB_0028af51:
          if ((result.m_backend.fpclass != cpp_dec_float_NaN) && ((int)uVar11 != 2)) {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result.m_backend,v);
            if (0 < iVar10) {
              uVar12 = piVar20[lVar19];
              if (0 < (int)uVar21) {
                do {
                  uVar17 = (uint)uVar15 - 1;
                  uVar13 = uVar17 >> 1;
                  uVar16 = (rhs2->m_backend).data._M_elems[uVar13];
                  uVar14 = (uint)uVar15;
                  if ((int)uVar12 <= (int)uVar16) break;
                  (rhs2->m_backend).data._M_elems[uVar15] = uVar16;
                  uVar15 = (ulong)uVar13;
                  uVar14 = uVar13;
                } while (1 < uVar17);
              }
              goto LAB_0028b013;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)(lVar23 + eps2.m_backend._48_8_),0);
          piVar5 = ridx2;
        }
        else {
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&result.m_backend,&result_2.m_backend);
          if (-1 < iVar10) {
            uVar11 = (ulong)v->fpclass;
            goto LAB_0028af51;
          }
          uVar12 = piVar20[lVar19];
          if (0 < (int)uVar21) {
            do {
              uVar17 = (uint)uVar15 - 1;
              uVar13 = uVar17 >> 1;
              uVar16 = (rhs2->m_backend).data._M_elems[uVar13];
              uVar14 = (uint)uVar15;
              if ((int)uVar12 <= (int)uVar16) break;
              (rhs2->m_backend).data._M_elems[uVar15] = uVar16;
              uVar15 = (ulong)uVar13;
              uVar14 = uVar13;
            } while (1 < uVar17);
          }
LAB_0028b013:
          uVar15 = (ulong)(uVar21 + 1);
          (rhs2->m_backend).data._M_elems[(int)uVar14] = uVar12;
          piVar5 = ridx2;
        }
        ridx2._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
        ridx2._0_4_ = (int)piVar5;
        uVar18 = (undefined4)uVar15;
        lVar22 = lVar22 + 1;
      } while (lVar22 < (int)ridx2);
    }
    piVar5 = (int *)CONCAT44(ridx2._4_4_,uVar18);
  }
  else {
    (rhs2->m_backend).data._M_elems[0] = this->thedim - 1;
  }
  uVar7 = eps2.m_backend.data._M_elems._0_8_;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_128.m_backend.exp = (eps->m_backend).exp;
  local_128.m_backend.neg = (eps->m_backend).neg;
  local_128.m_backend.fpclass = (eps->m_backend).fpclass;
  local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
  ridx2 = piVar5;
  rn = vSolveUright(this,vec,idx,rhs,ridx,rn,&local_128);
  vec_00 = vec2;
  local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar7;
  local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar7 + 8);
  local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar7 + 0x10);
  local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar7 + 0x18);
  local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar7 + 0x20);
  local_168.m_backend.exp = *(int *)(uVar7 + 0x28);
  local_168.m_backend.neg = *(bool *)(uVar7 + 0x2c);
  local_168.m_backend._48_8_ = *(undefined8 *)(uVar7 + 0x30);
  vSolveUrightNoNZ(this,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                   eps2.m_backend.data._M_elems[6],&local_168);
  vec_01 = eps2.m_backend.data._M_elems._32_8_;
  local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
  local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
  local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
  local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
  local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
  local_1a8.m_backend.exp = v->exp;
  local_1a8.m_backend.neg = v->neg;
  local_1a8.m_backend.fpclass = v->fpclass;
  local_1a8.m_backend.prec_elem = v->prec_elem;
  vSolveUrightNoNZ(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)eps2.m_backend.data._M_elems._32_8_,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend._48_8_,(int *)rhs2,(int)ridx2,&local_1a8);
  if ((this->l).updateType == 0) {
    local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_1e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_1e8.m_backend.exp = (eps->m_backend).exp;
    local_1e8.m_backend.neg = (eps->m_backend).neg;
    local_1e8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this,vec,idx,rn,&local_1e8);
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar7;
    local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar7 + 8);
    local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar7 + 0x10);
    local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar7 + 0x18);
    local_228.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar7 + 0x20);
    local_228.m_backend.exp = *(int *)(uVar7 + 0x28);
    local_228.m_backend.neg = *(bool *)(uVar7 + 0x2c);
    local_228.m_backend._48_8_ = *(undefined8 *)(uVar7 + 0x30);
    vSolveUpdateRightNoNZ(this,vec_00,&local_228);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
    local_268.m_backend.exp = v->exp;
    local_268.m_backend.neg = v->neg;
    local_268.m_backend.fpclass = v->fpclass;
    local_268.m_backend.prec_elem = v->prec_elem;
    vSolveUpdateRightNoNZ
              (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)vec_01,&local_268);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update3(R eps,
                                      R* vec, int* idx,                 /* result1 */
                                      R* rhs, int* ridx, int rn,        /* rhs1    */
                                      R* vec2, R eps2,               /* result2 */
                                      R* rhs2, int* ridx2, int rn2,     /* rhs2    */
                                      R* vec3, R eps3,               /* result3 */
                                      R* rhs3, int* ridx3, int rn3,     /* rhs3    */
                                      R* forest, int* forestNum, int* forestIdx)
{

   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;
   }

   if(rn3 > thedim * verySparseFactor4right)
   {
      ridx3[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn3; ++i)
      {
         k = ridx3[i];
         assert(k >= 0 && k < thedim);
         x = rhs3[k];

         if(x < -eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else if(x > eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else
            rhs3[k] = 0;
      }

      rn3 = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);
   vSolveUrightNoNZ(vec3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
      vSolveUpdateRightNoNZ(vec3, eps3);
   }

   return rn;
}